

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::XFileImporter::CreateAnimations(XFileImporter *this,aiScene *pScene,Scene *pData)

{
  double dVar1;
  value_type pString;
  undefined4 _x;
  undefined4 _x_00;
  undefined4 _x_01;
  undefined4 _x_02;
  undefined4 _y;
  undefined4 _y_00;
  undefined4 _y_01;
  undefined4 _y_02;
  undefined4 _z;
  undefined4 _z_00;
  undefined4 _z_01;
  undefined4 _z_02;
  aiQuatKey *paVar2;
  aiVectorKey *paVar3;
  float fVar4;
  bool bVar5;
  ulong uVar6;
  size_type sVar7;
  const_reference ppAVar8;
  aiAnimation *this_00;
  aiNodeAnim **ppaVar9;
  const_reference ppAVar10;
  aiNodeAnim *this_01;
  aiVectorKey *paVar11;
  aiQuatKey *paVar12;
  const_reference pvVar13;
  double *pdVar14;
  const_reference pvVar15;
  const_reference pvVar16;
  aiAnimation **ppaVar17;
  reference ppaVar18;
  aiVectorKey *local_2b8;
  aiQuatKey *local_290;
  aiVectorKey *local_268;
  aiVectorKey *local_218;
  aiQuatKey *local_1f0;
  aiVectorKey *local_1c8;
  uint local_188;
  uint local_184;
  uint a_1;
  uint c_3;
  float local_178;
  float fStack_174;
  undefined1 local_170 [8];
  aiMatrix3x3 rotmat_1;
  uint c_2;
  aiVector3D pos_1;
  uint c_1;
  undefined8 local_130;
  undefined1 local_128 [8];
  aiMatrix3x3 rotmat;
  aiVector3t<float> local_f8;
  aiVector3t<float> local_ec;
  undefined1 local_e0 [8];
  aiVector3D scale;
  aiVector3D pos;
  aiMatrix4x4 trafo;
  double time;
  uint c;
  aiNodeAnim *nbone;
  AnimBone *bone;
  uint b;
  aiAnimation *local_50;
  aiAnimation *nanim;
  Animation *anim;
  undefined1 local_38 [4];
  uint a;
  vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> newAnims;
  Scene *pData_local;
  aiScene *pScene_local;
  XFileImporter *this_local;
  
  newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pData;
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::vector
            ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38);
  for (anim._4_4_ = 0; uVar6 = (ulong)anim._4_4_,
      sVar7 = std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::
              size((vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                    *)(newAnims.super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7)), uVar6 < sVar7;
      anim._4_4_ = anim._4_4_ + 1) {
    ppAVar8 = std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::
              operator[]((vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>
                          *)(newAnims.
                             super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                         (ulong)anim._4_4_);
    nanim = (aiAnimation *)*ppAVar8;
    bVar5 = std::vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>::
            empty((vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_> *)
                  ((nanim->mName).data + 0x1c));
    if (!bVar5) {
      this_00 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(this_00);
      local_50 = this_00;
      std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::push_back
                ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38,&local_50);
      aiString::Set(&local_50->mName,(string *)nanim);
      local_50->mDuration = 0.0;
      local_50->mTicksPerSecond =
           (double)*(uint *)(newAnims.
                             super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 10);
      sVar7 = std::vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>::
              size((vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_> *)
                   ((nanim->mName).data + 0x1c));
      local_50->mNumChannels = (uint)sVar7;
      ppaVar9 = (aiNodeAnim **)operator_new__((ulong)local_50->mNumChannels << 3);
      local_50->mChannels = ppaVar9;
      for (bone._0_4_ = 0;
          sVar7 = std::vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                  ::size((vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                          *)((nanim->mName).data + 0x1c)), (uint)bone < sVar7;
          bone._0_4_ = (uint)bone + 1) {
        ppAVar10 = std::
                   vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>::
                   operator[]((vector<Assimp::XFile::AnimBone_*,_std::allocator<Assimp::XFile::AnimBone_*>_>
                               *)((nanim->mName).data + 0x1c),(ulong)(uint)bone);
        pString = *ppAVar10;
        this_01 = (aiNodeAnim *)operator_new(0x438);
        aiNodeAnim::aiNodeAnim(this_01);
        aiString::Set((aiString *)this_01,&pString->mBoneName);
        local_50->mChannels[(uint)bone] = this_01;
        bVar5 = std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                empty(&pString->mTrafoKeys);
        if (bVar5) {
          sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pString->mPosKeys);
          this_01->mNumPositionKeys = (uint)sVar7;
          uVar6 = (ulong)this_01->mNumPositionKeys;
          paVar11 = (aiVectorKey *)operator_new__(uVar6 * 0x18);
          if (uVar6 != 0) {
            local_268 = paVar11;
            do {
              aiVectorKey::aiVectorKey(local_268);
              local_268 = local_268 + 1;
            } while (local_268 != paVar11 + uVar6);
          }
          this_01->mPositionKeys = paVar11;
          for (pos_1.y = 0.0; (uint)pos_1.y < this_01->mNumPositionKeys;
              pos_1.y = (float)((int)pos_1.y + 1)) {
            pvVar15 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                (&pString->mPosKeys,(ulong)(uint)pos_1.y);
            rotmat_1.c3 = (pvVar15->mValue).x;
            c_2 = (uint)(pvVar15->mValue).y;
            pos_1.x = (pvVar15->mValue).z;
            pvVar15 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                (&pString->mPosKeys,(ulong)(uint)pos_1.y);
            this_01->mPositionKeys[(uint)pos_1.y].mTime = pvVar15->mTime;
            paVar11 = this_01->mPositionKeys;
            paVar3 = paVar11 + (uint)pos_1.y;
            (paVar3->mValue).x = rotmat_1.c3;
            (paVar3->mValue).y = (float)c_2;
            paVar11[(uint)pos_1.y].mValue.z = pos_1.x;
          }
          sVar7 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&pString->mRotKeys);
          this_01->mNumRotationKeys = (uint)sVar7;
          uVar6 = (ulong)this_01->mNumRotationKeys;
          paVar12 = (aiQuatKey *)operator_new__(uVar6 * 0x18);
          if (uVar6 != 0) {
            local_290 = paVar12;
            do {
              aiQuatKey::aiQuatKey(local_290);
              local_290 = local_290 + 1;
            } while (local_290 != paVar12 + uVar6);
          }
          this_01->mRotationKeys = paVar12;
          for (rotmat_1.c2 = 0.0; (uint)rotmat_1.c2 < this_01->mNumRotationKeys;
              rotmat_1.c2 = (float)((int)rotmat_1.c2 + 1)) {
            pvVar16 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[]
                                (&pString->mRotKeys,(ulong)(uint)rotmat_1.c2);
            aiQuaterniont<float>::GetMatrix((aiMatrix3x3t<float> *)local_170,&pvVar16->mValue);
            pvVar16 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[]
                                (&pString->mRotKeys,(ulong)(uint)rotmat_1.c2);
            this_01->mRotationKeys[(uint)rotmat_1.c2].mTime = pvVar16->mTime;
            aiQuaterniont<float>::aiQuaterniont
                      ((aiQuaterniont<float> *)&a_1,(aiMatrix3x3t<float> *)local_170);
            paVar12 = this_01->mRotationKeys;
            paVar2 = paVar12 + (uint)rotmat_1.c2;
            (paVar2->mValue).w = (float)a_1;
            (paVar2->mValue).x = (float)c_3;
            paVar12 = paVar12 + (uint)rotmat_1.c2;
            (paVar12->mValue).y = local_178;
            (paVar12->mValue).z = fStack_174;
            this_01->mRotationKeys[(uint)rotmat_1.c2].mValue.w =
                 this_01->mRotationKeys[(uint)rotmat_1.c2].mValue.w * -1.0;
          }
          sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pString->mScaleKeys)
          ;
          this_01->mNumScalingKeys = (uint)sVar7;
          uVar6 = (ulong)this_01->mNumScalingKeys;
          paVar11 = (aiVectorKey *)operator_new__(uVar6 * 0x18);
          if (uVar6 != 0) {
            local_2b8 = paVar11;
            do {
              aiVectorKey::aiVectorKey(local_2b8);
              local_2b8 = local_2b8 + 1;
            } while (local_2b8 != paVar11 + uVar6);
          }
          this_01->mScalingKeys = paVar11;
          for (local_184 = 0; local_184 < this_01->mNumScalingKeys; local_184 = local_184 + 1) {
            pvVar15 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                                (&pString->mScaleKeys,(ulong)local_184);
            paVar11 = this_01->mScalingKeys + local_184;
            paVar11->mTime = pvVar15->mTime;
            fVar4 = (pvVar15->mValue).y;
            (paVar11->mValue).x = (pvVar15->mValue).x;
            (paVar11->mValue).y = fVar4;
            (paVar11->mValue).z = (pvVar15->mValue).z;
          }
          sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pString->mPosKeys);
          if (sVar7 != 0) {
            pdVar14 = &local_50->mDuration;
            pvVar15 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::back
                                (&pString->mPosKeys);
            pdVar14 = std::max<double>(pdVar14,&pvVar15->mTime);
            local_50->mDuration = *pdVar14;
          }
          sVar7 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&pString->mRotKeys);
          if (sVar7 != 0) {
            pdVar14 = &local_50->mDuration;
            pvVar16 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::back(&pString->mRotKeys);
            pdVar14 = std::max<double>(pdVar14,&pvVar16->mTime);
            local_50->mDuration = *pdVar14;
          }
          sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&pString->mScaleKeys)
          ;
          if (sVar7 != 0) {
            pdVar14 = &local_50->mDuration;
            pvVar15 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::back
                                (&pString->mScaleKeys);
            pdVar14 = std::max<double>(pdVar14,&pvVar15->mTime);
            local_50->mDuration = *pdVar14;
          }
        }
        else {
          sVar7 = std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                  size(&pString->mTrafoKeys);
          this_01->mNumPositionKeys = (uint)sVar7;
          uVar6 = (ulong)this_01->mNumPositionKeys;
          paVar11 = (aiVectorKey *)operator_new__(uVar6 * 0x18);
          if (uVar6 != 0) {
            local_1c8 = paVar11;
            do {
              aiVectorKey::aiVectorKey(local_1c8);
              local_1c8 = local_1c8 + 1;
            } while (local_1c8 != paVar11 + uVar6);
          }
          this_01->mPositionKeys = paVar11;
          sVar7 = std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                  size(&pString->mTrafoKeys);
          this_01->mNumRotationKeys = (uint)sVar7;
          uVar6 = (ulong)this_01->mNumRotationKeys;
          paVar12 = (aiQuatKey *)operator_new__(uVar6 * 0x18);
          if (uVar6 != 0) {
            local_1f0 = paVar12;
            do {
              aiQuatKey::aiQuatKey(local_1f0);
              local_1f0 = local_1f0 + 1;
            } while (local_1f0 != paVar12 + uVar6);
          }
          this_01->mRotationKeys = paVar12;
          sVar7 = std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                  size(&pString->mTrafoKeys);
          this_01->mNumScalingKeys = (uint)sVar7;
          uVar6 = (ulong)this_01->mNumScalingKeys;
          paVar11 = (aiVectorKey *)operator_new__(uVar6 * 0x18);
          if (uVar6 != 0) {
            local_218 = paVar11;
            do {
              aiVectorKey::aiVectorKey(local_218);
              local_218 = local_218 + 1;
            } while (local_218 != paVar11 + uVar6);
          }
          this_01->mScalingKeys = paVar11;
          for (time._4_4_ = 0;
              sVar7 = std::
                      vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                      size(&pString->mTrafoKeys), time._4_4_ < sVar7; time._4_4_ = time._4_4_ + 1) {
            pvVar13 = std::
                      vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                      operator[](&pString->mTrafoKeys,(ulong)time._4_4_);
            dVar1 = pvVar13->mTime;
            pvVar13 = std::
                      vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>::
                      operator[](&pString->mTrafoKeys,(ulong)time._4_4_);
            _x = (pvVar13->mMatrix).a1;
            _x_00 = (pvVar13->mMatrix).a2;
            _x_01 = (pvVar13->mMatrix).a3;
            _x_02 = (pvVar13->mMatrix).a4;
            _y = (pvVar13->mMatrix).b1;
            _y_00 = (pvVar13->mMatrix).b2;
            _y_01 = (pvVar13->mMatrix).b3;
            _y_02 = (pvVar13->mMatrix).b4;
            _z = (pvVar13->mMatrix).c1;
            _z_00 = (pvVar13->mMatrix).c2;
            _z_01 = (pvVar13->mMatrix).c3;
            _z_02 = (pvVar13->mMatrix).c4;
            aiVector3t<float>::aiVector3t
                      ((aiVector3t<float> *)&scale.y,(float)_x_02,(float)_y_02,(float)_z_02);
            this_01->mPositionKeys[time._4_4_].mTime = dVar1;
            paVar11 = this_01->mPositionKeys;
            paVar11[time._4_4_].mValue.z = pos.x;
            paVar11 = paVar11 + time._4_4_;
            (paVar11->mValue).x = scale.y;
            (paVar11->mValue).y = scale.z;
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_e0);
            aiVector3t<float>::aiVector3t(&local_ec,(float)_x,(float)_y,(float)_z);
            local_e0._0_4_ = aiVector3t<float>::Length(&local_ec);
            aiVector3t<float>::aiVector3t(&local_f8,(float)_x_00,(float)_y_00,(float)_z_00);
            local_e0._4_4_ = aiVector3t<float>::Length(&local_f8);
            aiVector3t<float>::aiVector3t
                      ((aiVector3t<float> *)&rotmat.c2,(float)_x_01,(float)_y_01,(float)_z_01);
            scale.x = aiVector3t<float>::Length((aiVector3t<float> *)&rotmat.c2);
            this_01->mScalingKeys[time._4_4_].mTime = dVar1;
            paVar11 = this_01->mScalingKeys;
            paVar11[time._4_4_].mValue.z = scale.x;
            paVar11 = paVar11 + time._4_4_;
            (paVar11->mValue).x = (float)local_e0._0_4_;
            (paVar11->mValue).y = (float)local_e0._4_4_;
            aiMatrix3x3t<float>::aiMatrix3x3t
                      ((aiMatrix3x3t<float> *)local_128,(float)_x / (float)local_e0._0_4_,
                       (float)_x_00 / (float)local_e0._4_4_,(float)_x_01 / scale.x,
                       (float)_y / (float)local_e0._0_4_,(float)_y_00 / (float)local_e0._4_4_,
                       (float)_y_01 / scale.x,(float)_z / (float)local_e0._0_4_,
                       (float)_z_00 / (float)local_e0._4_4_,(float)_z_01 / scale.x);
            this_01->mRotationKeys[time._4_4_].mTime = dVar1;
            aiQuaterniont<float>::aiQuaterniont
                      ((aiQuaterniont<float> *)&pos_1.z,(aiMatrix3x3t<float> *)local_128);
            paVar12 = this_01->mRotationKeys;
            paVar2 = paVar12 + time._4_4_;
            (paVar2->mValue).w = pos_1.z;
            (paVar2->mValue).x = (float)c_1;
            paVar12 = paVar12 + time._4_4_;
            (paVar12->mValue).y = (float)(undefined4)local_130;
            (paVar12->mValue).z = (float)local_130._4_4_;
          }
          pdVar14 = &local_50->mDuration;
          pvVar13 = std::vector<Assimp::XFile::MatrixKey,_std::allocator<Assimp::XFile::MatrixKey>_>
                    ::back(&pString->mTrafoKeys);
          pdVar14 = std::max<double>(pdVar14,&pvVar13->mTime);
          local_50->mDuration = *pdVar14;
        }
      }
    }
  }
  sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size
                    ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38);
  if (sVar7 != 0) {
    sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size
                      ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38);
    pScene->mNumAnimations = (uint)sVar7;
    ppaVar17 = (aiAnimation **)operator_new__((ulong)pScene->mNumAnimations << 3);
    pScene->mAnimations = ppaVar17;
    for (local_188 = 0;
        sVar7 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size
                          ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38),
        local_188 < sVar7; local_188 = local_188 + 1) {
      ppaVar18 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                           ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38,
                            (ulong)local_188);
      pScene->mAnimations[local_188] = *ppaVar18;
    }
  }
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::~vector
            ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)local_38);
  return;
}

Assistant:

void XFileImporter::CreateAnimations( aiScene* pScene, const XFile::Scene* pData) {
    std::vector<aiAnimation*> newAnims;

    for( unsigned int a = 0; a < pData->mAnims.size(); ++a ) {
        const XFile::Animation* anim = pData->mAnims[a];
        // some exporters mock me with empty animation tags.
        if ( anim->mAnims.empty() ) {
            continue;
        }

        // create a new animation to hold the data
        aiAnimation* nanim = new aiAnimation;
        newAnims.push_back( nanim);
        nanim->mName.Set( anim->mName);
        // duration will be determined by the maximum length
        nanim->mDuration = 0;
        nanim->mTicksPerSecond = pData->mAnimTicksPerSecond;
        nanim->mNumChannels = (unsigned int)anim->mAnims.size();
        nanim->mChannels = new aiNodeAnim*[nanim->mNumChannels];

        for( unsigned int b = 0; b < anim->mAnims.size(); ++b ) {
            const XFile::AnimBone* bone = anim->mAnims[b];
            aiNodeAnim* nbone = new aiNodeAnim;
            nbone->mNodeName.Set( bone->mBoneName);
            nanim->mChannels[b] = nbone;

            // key-frames are given as combined transformation matrix keys
            if( !bone->mTrafoKeys.empty() )
            {
                nbone->mNumPositionKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mPositionKeys = new aiVectorKey[nbone->mNumPositionKeys];
                nbone->mNumRotationKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mRotationKeys = new aiQuatKey[nbone->mNumRotationKeys];
                nbone->mNumScalingKeys = (unsigned int)bone->mTrafoKeys.size();
                nbone->mScalingKeys = new aiVectorKey[nbone->mNumScalingKeys];

                for( unsigned int c = 0; c < bone->mTrafoKeys.size(); ++c)  {
                    // deconstruct each matrix into separate position, rotation and scaling
                    double time = bone->mTrafoKeys[c].mTime;
                    aiMatrix4x4 trafo = bone->mTrafoKeys[c].mMatrix;

                    // extract position
                    aiVector3D pos( trafo.a4, trafo.b4, trafo.c4);

                    nbone->mPositionKeys[c].mTime = time;
                    nbone->mPositionKeys[c].mValue = pos;

                    // extract scaling
                    aiVector3D scale;
                    scale.x = aiVector3D( trafo.a1, trafo.b1, trafo.c1).Length();
                    scale.y = aiVector3D( trafo.a2, trafo.b2, trafo.c2).Length();
                    scale.z = aiVector3D( trafo.a3, trafo.b3, trafo.c3).Length();
                    nbone->mScalingKeys[c].mTime = time;
                    nbone->mScalingKeys[c].mValue = scale;

                    // reconstruct rotation matrix without scaling
                    aiMatrix3x3 rotmat(
                        trafo.a1 / scale.x, trafo.a2 / scale.y, trafo.a3 / scale.z,
                        trafo.b1 / scale.x, trafo.b2 / scale.y, trafo.b3 / scale.z,
                        trafo.c1 / scale.x, trafo.c2 / scale.y, trafo.c3 / scale.z);

                    // and convert it into a quaternion
                    nbone->mRotationKeys[c].mTime = time;
                    nbone->mRotationKeys[c].mValue = aiQuaternion( rotmat);
                }

                // longest lasting key sequence determines duration
                nanim->mDuration = std::max( nanim->mDuration, bone->mTrafoKeys.back().mTime);
            } else {
                // separate key sequences for position, rotation, scaling
                nbone->mNumPositionKeys = (unsigned int)bone->mPosKeys.size();
                nbone->mPositionKeys = new aiVectorKey[nbone->mNumPositionKeys];
                for( unsigned int c = 0; c < nbone->mNumPositionKeys; ++c ) {
                    aiVector3D pos = bone->mPosKeys[c].mValue;

                    nbone->mPositionKeys[c].mTime = bone->mPosKeys[c].mTime;
                    nbone->mPositionKeys[c].mValue = pos;
                }

                // rotation
                nbone->mNumRotationKeys = (unsigned int)bone->mRotKeys.size();
                nbone->mRotationKeys = new aiQuatKey[nbone->mNumRotationKeys];
                for( unsigned int c = 0; c < nbone->mNumRotationKeys; ++c ) {
                    aiMatrix3x3 rotmat = bone->mRotKeys[c].mValue.GetMatrix();

                    nbone->mRotationKeys[c].mTime = bone->mRotKeys[c].mTime;
                    nbone->mRotationKeys[c].mValue = aiQuaternion( rotmat);
                    nbone->mRotationKeys[c].mValue.w *= -1.0f; // needs quat inversion
                }

                // scaling
                nbone->mNumScalingKeys = (unsigned int)bone->mScaleKeys.size();
                nbone->mScalingKeys = new aiVectorKey[nbone->mNumScalingKeys];
                for( unsigned int c = 0; c < nbone->mNumScalingKeys; c++)
                    nbone->mScalingKeys[c] = bone->mScaleKeys[c];

                // longest lasting key sequence determines duration
                if( bone->mPosKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mPosKeys.back().mTime);
                if( bone->mRotKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mRotKeys.back().mTime);
                if( bone->mScaleKeys.size() > 0)
                    nanim->mDuration = std::max( nanim->mDuration, bone->mScaleKeys.back().mTime);
            }
        }
    }

    // store all converted animations in the scene
    if( newAnims.size() > 0)
    {
        pScene->mNumAnimations = (unsigned int)newAnims.size();
        pScene->mAnimations = new aiAnimation* [pScene->mNumAnimations];
        for( unsigned int a = 0; a < newAnims.size(); a++)
            pScene->mAnimations[a] = newAnims[a];
    }
}